

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crt_abstractions.c
# Opt level: O1

int unsignedIntToString(char *destination,size_t destinationSize,uint value)

{
  ulong uVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  uint uVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  
  iVar3 = 0x2fb;
  if (1 < destinationSize && destination != (char *)0x0) {
    pcVar5 = destination + -1;
    uVar8 = 0xffffffffffffffff;
    do {
      uVar6 = value;
      pcVar4 = pcVar5;
      pcVar4[1] = (char)uVar6 + (char)(uVar6 / 10) * -10 | 0x30;
      pcVar5 = pcVar4 + 1;
      uVar1 = uVar8 + 1;
      if (uVar6 < 10) break;
      uVar9 = uVar8 + 2;
      uVar8 = uVar1;
      value = uVar6 / 10;
    } while (uVar9 < destinationSize - 1);
    iVar3 = 0x318;
    if (uVar6 < 10) {
      pcVar4[2] = '\0';
      iVar3 = 0;
      lVar7 = 0;
      do {
        cVar2 = destination[lVar7];
        destination[lVar7] = *pcVar5;
        *pcVar5 = cVar2;
        lVar7 = lVar7 + 1;
        pcVar5 = pcVar5 + -1;
      } while ((uVar1 >> 1) + 1 != lVar7);
    }
  }
  return iVar3;
}

Assistant:

int unsignedIntToString(char* destination, size_t destinationSize, unsigned int value)
{
    int result;
    size_t pos;
    /*the below loop gets the number in reverse order*/
    /*Codes_SRS_CRT_ABSTRACTIONS_02_003: [If destination is NULL then unsignedIntToString shall fail.] */
    /*Codes_SRS_CRT_ABSTRACTIONS_02_002: [If the conversion fails for any reason (for example, insufficient buffer space), a non-zero return value shall be supplied and unsignedIntToString shall fail.] */
    if (
        (destination == NULL) ||
        (destinationSize < 2) /*because the smallest number is '0\0' which requires 2 characters*/
        )
    {
        result = MU_FAILURE;
    }
    else
    {
        pos = 0;
        do
        {
            destination[pos++] = '0' + (value % 10);
            value /= 10;
        } while ((value > 0) && (pos < (destinationSize-1)));

        if (value == 0)
        {
            size_t w;
            destination[pos] = '\0';
            /*all converted and they fit*/
            for (w = 0; w <= (pos-1) >> 1; w++)
            {
                char temp;
                temp = destination[w];
                destination[w] = destination[pos - 1 - w];
                destination[pos -1 - w] = temp;
            }
            /*Codes_SRS_CRT_ABSTRACTIONS_02_004: [If the conversion has been successfull then unsignedIntToString shall return 0.] */
            result = 0;
        }
        else
        {
            /*Codes_SRS_CRT_ABSTRACTIONS_02_002: [If the conversion fails for any reason (for example, insufficient buffer space), a non-zero return value shall be supplied and unsignedIntToString shall fail.] */
            result = MU_FAILURE;
        }
    }
    return result;
}